

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fastprojectile.cpp
# Opt level: O2

void __thiscall AFastProjectile::Tick(AFastProjectile *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  sector_t *psVar6;
  bool bVar7;
  bool bVar8;
  AActor *target;
  line_t *line;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  double dVar13;
  DVector3 local_108;
  double local_e8;
  double dStack_e0;
  DVector2 local_d8;
  FCheckPosition tm;
  
  AActor::ClearInterpolation(&this->super_AActor);
  if (((this->super_AActor).flags5.Value & 0x400000) == 0) {
    if ((bglobal._16_1_ & 1) != 0) {
      return;
    }
    if (((byte)level.flags2 & 0x20) != 0) {
      return;
    }
  }
  FCheckPosition::FCheckPosition(&tm,(bool)((byte)((this->super_AActor).flags2.Value >> 8) & 1));
  dVar2 = (this->super_AActor).radius;
  if (dVar2 <= 0.0) {
    iVar10 = 8;
  }
  else {
    iVar11 = 8;
    do {
      do {
        iVar10 = iVar11;
        dVar13 = (double)iVar10 * dVar2;
        iVar11 = iVar10 * 2;
      } while (dVar13 < ABS((this->super_AActor).Vel.X));
    } while (dVar13 < ABS((this->super_AActor).Vel.Y));
  }
  bVar8 = TVector3<double>::isZero(&(this->super_AActor).Vel);
  if (bVar8) {
    dVar2 = (this->super_AActor).__Pos.Z;
    pdVar1 = &(this->super_AActor).floorz;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) goto LAB_0055e251;
  }
  dVar13 = 1.0 / (double)iVar10;
  dVar2 = (this->super_AActor).Vel.Z;
  local_e8 = dVar13 * (this->super_AActor).Vel.X;
  dStack_e0 = dVar13 * (this->super_AActor).Vel.Y;
  bVar8 = local_e8 != 0.0;
  bVar7 = dStack_e0 != 0.0;
  iVar9 = iVar10 >> 3;
  iVar11 = iVar9;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
    if (bVar7 || bVar8) {
      if (iVar11 < 2) {
        TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::Clear(&tm.LastRipped,1);
      }
      local_108.X = (this->super_AActor).__Pos.X + local_e8;
      local_108.Y = (this->super_AActor).__Pos.Y + dStack_e0;
      bVar12 = P_TryMove(&this->super_AActor,(DVector2 *)&local_108,1,(secplane_t *)0x0,&tm,false);
      if (bVar12) {
        iVar11 = iVar11 + -1;
        goto LAB_0055e1da;
      }
      if (((this->super_AActor).flags3.Value & 0x4000) == 0) {
        if (((tm.ceilingline == (line_t *)0x0) ||
            (psVar6 = (tm.ceilingline)->backsector, psVar6 == (sector_t *)0x0)) ||
           (psVar6->planes[1].Texture.texnum != skyflatnum.texnum)) {
LAB_0055e380:
          line = (this->super_AActor).BlockingLine;
          if (line == (line_t *)0x0) {
            line = (line_t *)0x0;
          }
          else if (line->special == 9) goto LAB_0055e392;
          goto LAB_0055e3a8;
        }
        dVar2 = (this->super_AActor).__Pos.Z;
        AActor::PosRelative(&local_108,&this->super_AActor,tm.ceilingline);
        local_d8.X = local_108.X;
        local_d8.Y = local_108.Y;
        dVar13 = secplane_t::ZatPoint(&psVar6->ceilingplane,&local_d8);
        if (dVar2 < dVar13) goto LAB_0055e380;
        goto LAB_0055e392;
      }
      line = (this->super_AActor).BlockingLine;
LAB_0055e3a8:
      target = (this->super_AActor).BlockingMobj;
LAB_0055e3af:
      P_ExplodeMissile(&this->super_AActor,line,target);
      goto LAB_0055e3b7;
    }
LAB_0055e1da:
    (this->super_AActor).__Pos.Z = (this->super_AActor).__Pos.Z + dVar13 * dVar2;
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x24])(this);
    dVar3 = (this->super_AActor).__Pos.Z;
    dVar4 = (this->super_AActor).floorz;
    if (dVar3 <= dVar4) {
      if (((this->super_AActor).floorpic.texnum != skyflatnum.texnum) ||
         (((this->super_AActor).flags3.Value & 0x4000) != 0)) {
        (this->super_AActor).__Pos.Z = dVar4;
        P_HitFloor(&this->super_AActor);
LAB_0055e2ff:
        line = (line_t *)0x0;
        target = (AActor *)0x0;
        goto LAB_0055e3af;
      }
LAB_0055e392:
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
      goto LAB_0055e3b7;
    }
    dVar4 = (this->super_AActor).ceilingz;
    dVar5 = (this->super_AActor).Height;
    if (dVar4 < dVar3 + dVar5) {
      if (((this->super_AActor).ceilingpic.texnum == skyflatnum.texnum) &&
         (((this->super_AActor).flags3.Value & 0x4000) == 0)) goto LAB_0055e392;
      (this->super_AActor).__Pos.Z = dVar4 - dVar5;
      goto LAB_0055e2ff;
    }
    if (iVar11 < 1 && (bVar7 || bVar8)) {
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])(this);
      iVar11 = iVar9;
    }
  }
LAB_0055e251:
  bVar8 = AActor::CheckNoDelay(&this->super_AActor);
  if ((bVar8) && (iVar10 = (this->super_AActor).tics, iVar10 != -1)) {
    if (0 < iVar10) {
      iVar10 = iVar10 + -1;
      (this->super_AActor).tics = iVar10;
    }
    if (iVar10 == 0) {
      do {
        bVar8 = AActor::SetState(&this->super_AActor,((this->super_AActor).state)->NextState,false);
      } while (bVar8 && (this->super_AActor).tics == 0);
    }
  }
LAB_0055e3b7:
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::~TMap(&tm.LastRipped);
  return;
}

Assistant:

void AFastProjectile::Tick ()
{
	int i;
	DVector3 frac;
	int changexy;

	ClearInterpolation();
	double oldz = Z();

	if (!(flags5 & MF5_NOTIMEFREEZE))
	{
		//Added by MC: Freeze mode.
		if (bglobal.freeze || level.flags2 & LEVEL2_FROZEN)
		{
			return;
		}
	}


	// [RH] Ripping is a little different than it was in Hexen
	FCheckPosition tm(!!(flags2 & MF2_RIP));

	int count = 8;
	if (radius > 0)
	{
		while ( fabs(Vel.X) > radius * count || fabs(Vel.Y) > radius * count)
		{
			// we need to take smaller steps.
			count += count;
		}
	}

	// Handle movement
	if (!Vel.isZero() || (Z() != floorz))
	{
		frac = Vel / count;
		changexy = frac.X != 0 || frac.Y != 0;
		int ripcount = count / 8;
		for (i = 0; i < count; i++)
		{
			if (changexy)
			{
				if (--ripcount <= 0)
				{
					tm.LastRipped.Clear();	// [RH] Do rip damage each step, like Hexen
				}
				
				if (!P_TryMove (this, Pos() + frac, true, NULL, tm))
				{ // Blocked move
					if (!(flags3 & MF3_SKYEXPLODE))
					{
						if (tm.ceilingline &&
							tm.ceilingline->backsector &&
							tm.ceilingline->backsector->GetTexture(sector_t::ceiling) == skyflatnum &&
							Z() >= tm.ceilingline->backsector->ceilingplane.ZatPoint(PosRelative(tm.ceilingline)))
						{
							// Hack to prevent missiles exploding against the sky.
							// Does not handle sky floors.
							Destroy ();
							return;
						}
						// [RH] Don't explode on horizon lines.
						if (BlockingLine != NULL && BlockingLine->special == Line_Horizon)
						{
							Destroy ();
							return;
						}
					}

					P_ExplodeMissile (this, BlockingLine, BlockingMobj);
					return;
				}
			}
			AddZ(frac.Z);
			UpdateWaterLevel ();
			oldz = Z();
			if (oldz <= floorz)
			{ // Hit the floor

				if (floorpic == skyflatnum && !(flags3 & MF3_SKYEXPLODE))
				{
					// [RH] Just remove the missile without exploding it
					//		if this is a sky floor.
					Destroy ();
					return;
				}

				SetZ(floorz);
				P_HitFloor (this);
				P_ExplodeMissile (this, NULL, NULL);
				return;
			}
			if (Top() > ceilingz)
			{ // Hit the ceiling

				if (ceilingpic == skyflatnum &&  !(flags3 & MF3_SKYEXPLODE))
				{
					Destroy ();
					return;
				}

				SetZ(ceilingz - Height);
				P_ExplodeMissile (this, NULL, NULL);
				return;
			}
			if (changexy && ripcount <= 0) 
			{
				ripcount = count >> 3;
				Effect();
			}
		}
	}
	if (!CheckNoDelay())
		return;		// freed itself
	// Advance the state
	if (tics != -1)
	{
		if (tics > 0) tics--;
		while (!tics)
		{
			if (!SetState (state->GetNextState ()))
			{ // mobj was removed
				return;
			}
		}
	}
}